

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O1

void __thiscall
Refal2::
CDictionary<std::unique_ptr<Refal2::CPreparatoryFunction,_std::default_delete<Refal2::CPreparatoryFunction>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::Empty(CDictionary<std::unique_ptr<Refal2::CPreparatoryFunction,_std::default_delete<Refal2::CPreparatoryFunction>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *this)

{
  CPreparatoryFunction *__ptr;
  long lVar1;
  default_delete<Refal2::CPreparatoryFunction> *this_00;
  long lVar2;
  
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::clear(&(this->keyToIndex)._M_t);
  if (0 < this->size) {
    lVar2 = 8;
    lVar1 = 0;
    do {
      __ptr = *(CPreparatoryFunction **)((long)&(this->keyDataPairs->key)._M_node + lVar2);
      this_00 = (default_delete<Refal2::CPreparatoryFunction> *)
                ((long)&(this->keyDataPairs->key)._M_node + lVar2);
      if (__ptr != (CPreparatoryFunction *)0x0) {
        std::default_delete<Refal2::CPreparatoryFunction>::operator()(this_00,__ptr);
      }
      *(undefined8 *)this_00 = 0;
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0x10;
    } while (lVar1 < this->size);
  }
  this->size = 0;
  return;
}

Assistant:

void CDictionary<Data, Key>::Empty()
{
	keyToIndex.clear();
	for( int i = 0; i < size; i++ ) {
		keyDataPairs[i].~CKeyDataPair();
	}
	size = 0;
}